

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_flattening.cpp
# Opt level: O0

void __thiscall
ModelFlattening_flatteningComplexBondGraph_Test::~ModelFlattening_flatteningComplexBondGraph_Test
          (ModelFlattening_flatteningComplexBondGraph_Test *this)

{
  ModelFlattening_flatteningComplexBondGraph_Test *this_local;
  
  ~ModelFlattening_flatteningComplexBondGraph_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ModelFlattening, flatteningComplexBondGraph)
{
    auto importer = libcellml::Importer::create(false);
    auto parser = libcellml::Parser::create(false);

    auto model = parser->parseModel(fileContents("importer/complexbondgraph/cpp_coupling.cellml"));
    importer->resolveImports(model, resourcePath("importer/complexbondgraph"));

    auto flatModel = importer->flattenModel(model);
    EXPECT_EQ("C_main_vessel", flatModel->component(0)->variable(1)->name());
    EXPECT_EQ(size_t(1), flatModel->component(0)->variable(0)->equivalentVariableCount());
    EXPECT_EQ("C", flatModel->component(2)->variable(2)->name());
    EXPECT_EQ(size_t(2), flatModel->component(2)->variable(2)->equivalentVariableCount());
    EXPECT_EQ("C", flatModel->component(3)->variable(4)->name());
    EXPECT_EQ(size_t(1), flatModel->component(3)->variable(4)->equivalentVariableCount());
}